

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_util.cc
# Opt level: O3

bool bssl::IPAddressMatchesWithNetmask(Input addr1,Input addr2,Input mask)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  
  sVar2 = addr1.data_.size_;
  if (mask.data_.size_ != sVar2 || addr2.data_.size_ != sVar2) {
    return false;
  }
  if (sVar2 != 0) {
    lVar1 = 0;
    do {
      bVar3 = (mask.data_.data_[lVar1] & (addr2.data_.data_[lVar1] ^ addr1.data_.data_[lVar1])) == 0
      ;
      if (!bVar3) {
        return bVar3;
      }
      bVar4 = sVar2 - 1 != lVar1;
      lVar1 = lVar1 + 1;
    } while (bVar4);
    return bVar3;
  }
  return true;
}

Assistant:

bool IPAddressMatchesWithNetmask(der::Input addr1, der::Input addr2,
                                 der::Input mask) {
  if (addr1.size() != addr2.size() || addr1.size() != mask.size()) {
    return false;
  }
  for (size_t i = 0; i < addr1.size(); i++) {
    if ((addr1[i] & mask[i]) != (addr2[i] & mask[i])) {
      return false;
    }
  }
  return true;
}